

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_trs.cc
# Opt level: O1

int X509_check_trust(X509 *x,int id,int flags)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (id == -1) {
    iVar1 = 1;
  }
  else {
    if (id != 0) {
      lVar3 = 0;
      lVar2 = 0;
      do {
        if (*(int *)((long)&trstandard[0].trust + lVar2) == id) {
          lVar3 = (long)&trstandard[0].trust + lVar2;
          break;
        }
        lVar2 = lVar2 + 0x18;
      } while (lVar2 != 0x90);
      if (lVar3 == 0) {
        iVar1 = obj_trust(id,(X509 *)x);
        return iVar1;
      }
      iVar1 = (**(code **)(lVar3 + 8))(lVar3,x);
      return iVar1;
    }
    iVar1 = obj_trust(0x38e,(X509 *)x);
    if (iVar1 == 3) {
      iVar1 = x509v3_cache_extensions((X509 *)x);
      if (iVar1 == 0) {
        iVar1 = 3;
      }
      else {
        iVar1 = (uint)(((x->ex_data).dummy & 0x2000) == 0) * 2 + 1;
      }
    }
  }
  return iVar1;
}

Assistant:

int X509_check_trust(X509 *x, int id, int flags) {
  if (id == -1) {
    return X509_TRUST_TRUSTED;
  }
  // We get this as a default value
  if (id == 0) {
    int rv = obj_trust(NID_anyExtendedKeyUsage, x);
    if (rv != X509_TRUST_UNTRUSTED) {
      return rv;
    }
    return trust_compat(NULL, x);
  }
  const X509_TRUST *pt = X509_TRUST_get0(id);
  if (pt == NULL) {
    // Unknown trust IDs are silently reintrepreted as NIDs. This is unreachable
    // from the certificate verifier itself, but wpa_supplicant relies on it.
    // Note this relies on commonly-used NIDs and trust IDs not colliding.
    return obj_trust(id, x);
  }
  return pt->check_trust(pt, x);
}